

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O2

uint __thiscall
RigidBodyDynamics::InverseKinematicsConstraintSet::AddPointConstraintXY
          (InverseKinematicsConstraintSet *this,uint body_id,Vector3d *body_point,
          Vector3d *target_pos,float weight)

{
  float local_88;
  uint local_84;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_80 [8];
  undefined8 local_78;
  ConstraintType local_70 [18];
  
  local_70[0] = ConstraintTypePositionXY;
  local_88 = weight;
  local_84 = body_id;
  std::
  vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
  ::emplace_back<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>
            (&this->constraint_type,local_70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->body_ids,&local_84);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back(&this->body_points,body_point);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back(&this->target_positions,target_pos);
  local_78 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_70,local_80);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::emplace_back<Matrix3_t>
            (&this->target_orientations,(Matrix3_t *)local_70);
  std::vector<float,_std::allocator<float>_>::push_back(&this->constraint_weight,&local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->constraint_row_index,&this->num_constraints);
  this->num_constraints = this->num_constraints + 2;
  return (int)((ulong)((long)(this->constraint_type).
                             super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->constraint_type).
                            super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
}

Assistant:

unsigned int InverseKinematicsConstraintSet::AddPointConstraintXY(
    unsigned int body_id,
    const Vector3d& body_point,
    const Vector3d& target_pos,
    float weight
    ) {
  constraint_type.push_back (ConstraintTypePositionXY);
  body_ids.push_back(body_id);
  body_points.push_back(body_point);
  target_positions.push_back(target_pos);
  target_orientations.push_back(Matrix3d::Zero());
  constraint_weight.push_back(weight);
  constraint_row_index.push_back(num_constraints);
  num_constraints = num_constraints + 2;
  return constraint_type.size() - 1;
}